

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::View<int,false,std::allocator<unsigned_long>>::assign<unsigned_long*,unsigned_long_const*>
          (View<int,false,std::allocator<unsigned_long>> *this,unsigned_long *begin,
          unsigned_long *end,unsigned_long *it,pointer data,CoordinateOrder *internalCoordinateOrder
          ,allocator_type *allocator)

{
  allocator_type local_51;
  Geometry<std::allocator<unsigned_long>_> local_50;
  
  marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<unsigned_long*,unsigned_long_const*>
            ((Geometry<std::allocator<unsigned_long>> *)&local_50,begin,end,it,
             internalCoordinateOrder,&local_51);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
            ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_50);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_50);
  *(pointer *)this = data;
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline void
View<T, isConst, A>::assign
(
    ShapeIterator begin,
    ShapeIterator end,
    StrideIterator it,
    pointer data,
    const CoordinateOrder& internalCoordinateOrder,
    const allocator_type& allocator
)
{
    // the invariant is not tested as a pre-condition of this
    // function to allow for unsafe manipulations prior to its
    // call
    geometry_ = typename marray_detail::Geometry<A>(begin, end, 
        it, internalCoordinateOrder, allocator);
    data_ = data;
    testInvariant();
}